

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode proxy_magic(connectdata *conn,char *newhost,unsigned_short newport,_Bool *magicdone)

{
  undefined8 uVar1;
  CURLcode CVar2;
  FTP *ftp_save;
  HTTP http_proxy;
  SessionHandle *data;
  CURLcode result;
  _Bool *magicdone_local;
  unsigned_short newport_local;
  char *newhost_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  http_proxy.send_buffer = conn->data;
  *magicdone = false;
  switch(conn->proxytype) {
  case CURLPROXY_HTTP:
  case CURLPROXY_HTTP_1_0:
    break;
  default:
    Curl_failf((SessionHandle *)http_proxy.send_buffer,"unknown proxytype option given");
    data._4_4_ = CURLE_COULDNT_CONNECT;
    break;
  case CURLPROXY_SOCKS4:
    data._4_4_ = Curl_SOCKS4(conn->proxyuser,newhost,(uint)newport,1,conn,false);
    *magicdone = true;
    break;
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    data._4_4_ = Curl_SOCKS5(conn->proxyuser,conn->proxypasswd,newhost,(uint)newport,1,conn);
    *magicdone = true;
    break;
  case CURLPROXY_SOCKS4A:
    data._4_4_ = Curl_SOCKS4(conn->proxyuser,newhost,(uint)newport,1,conn,true);
    *magicdone = true;
  }
  if ((((conn->bits).tunnel_proxy & 1U) != 0) && (((conn->bits).httpproxy & 1U) != 0)) {
    uVar1 = *(undefined8 *)((long)http_proxy.send_buffer + 0x1a8);
    memset(&ftp_save,0,0x88);
    *(FTP ***)((long)http_proxy.send_buffer + 0x1a8) = &ftp_save;
    CVar2 = Curl_proxyCONNECT(conn,1,newhost,(uint)newport,true);
    *(undefined8 *)((long)http_proxy.send_buffer + 0x1a8) = uVar1;
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    if (conn->tunnel_state[1] != TUNNEL_COMPLETE) {
      _state(conn,FTP_STOP);
      return CURLE_OK;
    }
    *magicdone = true;
    data._4_4_ = CURLE_OK;
  }
  return data._4_4_;
}

Assistant:

static CURLcode proxy_magic(struct connectdata *conn,
                            char *newhost, unsigned short newport,
                            bool *magicdone)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

#if defined(CURL_DISABLE_PROXY)
  (void) newhost;
  (void) newport;
#endif

  *magicdone = FALSE;

  switch(conn->proxytype) {
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    result = Curl_SOCKS5(conn->proxyuser, conn->proxypasswd, newhost,
                         newport, SECONDARYSOCKET, conn);
    *magicdone = TRUE;
    break;
  case CURLPROXY_SOCKS4:
    result = Curl_SOCKS4(conn->proxyuser, newhost, newport,
                         SECONDARYSOCKET, conn, FALSE);
    *magicdone = TRUE;
    break;
  case CURLPROXY_SOCKS4A:
    result = Curl_SOCKS4(conn->proxyuser, newhost, newport,
                         SECONDARYSOCKET, conn, TRUE);
    *magicdone = TRUE;
    break;
  case CURLPROXY_HTTP:
  case CURLPROXY_HTTP_1_0:
    /* do nothing here. handled later. */
    break;
  default:
    failf(data, "unknown proxytype option given");
    result = CURLE_COULDNT_CONNECT;
    break;
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
    /* BLOCKING */
    /* We want "seamless" FTP operations through HTTP proxy tunnel */

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the
     * member conn->proto.http; we want FTP through HTTP and we have to
     * change the member temporarily for connecting to the HTTP proxy. After
     * Curl_proxyCONNECT we have to set back the member to the original
     * struct FTP pointer
     */
    struct HTTP http_proxy;
    struct FTP *ftp_save = data->req.protop;
    memset(&http_proxy, 0, sizeof(http_proxy));
    data->req.protop = &http_proxy;

    result = Curl_proxyCONNECT(conn, SECONDARYSOCKET, newhost, newport, TRUE);

    data->req.protop = ftp_save;

    if(result)
      return result;

    if(conn->tunnel_state[SECONDARYSOCKET] != TUNNEL_COMPLETE) {
      /* the CONNECT procedure is not complete, the tunnel is not yet up */
      state(conn, FTP_STOP); /* this phase is completed */
      return result;
    }
    else
      *magicdone = TRUE;
  }

  return result;
}